

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringUtils.cpp
# Opt level: O1

string * __thiscall
OpenMD::OpenMD_itoa_abi_cxx11_(string *__return_storage_ptr__,OpenMD *this,int value,uint base)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long *plVar2;
  ulong uVar3;
  int iVar4;
  bool bVar5;
  string buf;
  string sign;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  undefined1 *local_78;
  undefined8 local_70;
  undefined1 local_68;
  undefined7 uStack_67;
  string *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  paVar1 = &local_98.field_2;
  local_98._M_string_length = 0;
  local_98.field_2._M_local_buf[0] = '\0';
  local_98._M_dataplus._M_p = (pointer)paVar1;
  if (value - 0x11U < 0xfffffff0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    *(ulong *)((long)&__return_storage_ptr__->field_2 + 1) =
         CONCAT17(local_98.field_2._M_local_buf[8],local_98.field_2._M_allocated_capacity._1_7_);
    *(undefined4 *)((long)&__return_storage_ptr__->field_2 + 9) = local_98.field_2._9_4_;
    *(undefined2 *)((long)&__return_storage_ptr__->field_2 + 0xd) = local_98.field_2._13_2_;
    (__return_storage_ptr__->field_2)._M_local_buf[0xf] = local_98.field_2._M_local_buf[0xf];
    __return_storage_ptr__->_M_string_length = 0;
  }
  else {
    iVar4 = (int)this;
    uVar3 = (ulong)this & 0xffffffff;
    if (iVar4 != 0) {
      local_78 = &local_68;
      local_70 = 0;
      local_68 = 0;
      local_58 = __return_storage_ptr__;
      if (iVar4 < 0) {
        std::__cxx11::string::_M_replace((ulong)&local_78,0,(char *)0x0,0x29f16d);
        uVar3 = (ulong)(uint)-iVar4;
      }
      iVar4 = -0x1d;
      do {
        std::operator+(&local_50,"0123456789abcdef"[uVar3 % (ulong)(uint)value],&local_98);
        std::__cxx11::string::operator=((string *)&local_98,(string *)&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
      } while (((uint)value <= (uint)uVar3) &&
              (bVar5 = iVar4 != 0, uVar3 = uVar3 / (uint)value, iVar4 = iVar4 + 1, bVar5));
      plVar2 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_78,(ulong)local_98._M_dataplus._M_p);
      __return_storage_ptr__ = local_58;
      (local_58->_M_dataplus)._M_p = (pointer)&local_58->field_2;
      std::__cxx11::string::_M_construct<char*>((string *)local_58,*plVar2,plVar2[1] + *plVar2);
      if (local_78 != &local_68) {
        operator_delete(local_78,CONCAT71(uStack_67,local_68) + 1);
      }
      goto LAB_00247b7d;
    }
    std::__cxx11::string::_M_replace((ulong)&local_98,0,(char *)0x0,0x2aab1b);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p == paVar1) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(local_98.field_2._M_allocated_capacity._1_7_,local_98.field_2._M_local_buf[0]);
      *(ulong *)((long)&__return_storage_ptr__->field_2 + 8) =
           CONCAT17(local_98.field_2._M_local_buf[0xf],
                    CONCAT25(local_98.field_2._13_2_,
                             CONCAT41(local_98.field_2._9_4_,local_98.field_2._M_local_buf[8])));
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = local_98._M_dataplus._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(local_98.field_2._M_allocated_capacity._1_7_,local_98.field_2._M_local_buf[0]);
    }
    __return_storage_ptr__->_M_string_length = local_98._M_string_length;
  }
  local_98._M_string_length = 0;
  local_98.field_2._M_local_buf[0] = '\0';
  local_98._M_dataplus._M_p = (pointer)paVar1;
LAB_00247b7d:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,
                    CONCAT71(local_98.field_2._M_allocated_capacity._1_7_,
                             local_98.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string OpenMD_itoa(int value, unsigned int base) {
    const char digitMap[] = "0123456789abcdef";
    std::string buf;

    if (base == 0 || base > 16) { return buf; }

    if (value == 0) {
      buf = "0";
      return buf;
    }

    // Take care negative int:

    std::string sign;
    int _value = value;
    if (value < 0) {
      _value = -value;
      sign   = "-";
    }

    // Translating number to string with base:
    for (int i = 30; _value && i; --i) {
      buf = digitMap[_value % base] + buf;
      _value /= base;
    }
    return sign.append(buf);
  }